

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tctok.cpp
# Opt level: O0

void __thiscall CTcTokenizer::add_inc_path(CTcTokenizer *this,char *path)

{
  size_t sVar1;
  undefined8 *puVar2;
  char *in_RSI;
  long in_RDI;
  tctok_incpath_t *entry;
  
  sVar1 = strlen(in_RSI);
  puVar2 = (undefined8 *)malloc(sVar1 + 0x10);
  strcpy((char *)(puVar2 + 1),in_RSI);
  if (*(long *)(in_RDI + 0x30) == 0) {
    *(undefined8 **)(in_RDI + 0x28) = puVar2;
  }
  else {
    **(undefined8 **)(in_RDI + 0x30) = puVar2;
  }
  *(undefined8 **)(in_RDI + 0x30) = puVar2;
  *puVar2 = 0;
  return;
}

Assistant:

void CTcTokenizer::add_inc_path(const char *path)
{
    tctok_incpath_t *entry;
    
    /* create a new path list entry */
    entry = (tctok_incpath_t *)t3malloc(sizeof(tctok_incpath_t)
                                        + strlen(path));

    /* store the path in the entry */
    strcpy(entry->path, path);

    /* link this entry at the end of our list */
    if (incpath_tail_ != 0)
        incpath_tail_->nxt = entry;
    else
        incpath_head_ = entry;
    incpath_tail_ = entry;
    entry->nxt = 0;
}